

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  CameraSample sample;
  ulong uVar2;
  int iVar3;
  Array path;
  Array path_00;
  ulong uVar4;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  TVar5;
  int maxDepth;
  uintptr_t iptr;
  Float FVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [56];
  float fVar15;
  undefined8 uVar18;
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [56];
  undefined1 in_register_00001284 [12];
  Bounds2f BVar20;
  SampledSpectrum SVar21;
  int local_16c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  optional<pbrt::Point2<float>_> pRasterNew;
  SamplerHandle local_e8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_e0;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_d8;
  uintptr_t local_d0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_c8;
  SamplerHandle local_c0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_b8;
  SamplerHandle local_b0;
  optional<pbrt::CameraRayDifferential> crd;
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar17 [64];
  
  uVar18 = in_ZMM1._12_8_;
  MLTSampler::StartStream(sampler,0);
  if (depth == 0) {
    local_16c = 0;
    maxDepth = 2;
    fVar15 = 1.0;
  }
  else {
    FVar6 = MLTSampler::Get1D(sampler);
    fVar15 = (float)(depth + 2);
    local_16c = depth + 1;
    if ((int)(FVar6 * fVar15) <= depth + 1) {
      local_16c = (int)(FVar6 * fVar15);
    }
    maxDepth = (depth + 2) - local_16c;
  }
  if (*(char *)(Options + 6) == '\x01') {
    FVar6 = 0.5;
  }
  else {
    FVar6 = MLTSampler::Get1D(sampler);
  }
  SampledWavelengths::SampleXYZ((SampledWavelengths *)&crd,FVar6);
  *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values = crd.optionalValue.__align;
  *(undefined8 *)((lambda->lambda).values + 2) = crd.optionalValue._8_8_;
  *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
  *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  local_158._8_8_ = crd.optionalValue._8_8_;
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)maxDepth);
  BVar20 = FilmBase::SampleBounds
                     ((FilmBase *)
                      (*(ulong *)(((this->camera).
                                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                   .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff));
  local_158._0_4_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  local_158._4_4_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  auVar11._0_8_ = MLTSampler::Get2D(sampler);
  auVar11._8_56_ = extraout_var;
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar16,auVar11._0_16_);
  local_148 = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_144 = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_140 = (float)uVar18;
  fStack_13c = (float)((ulong)uVar18 >> 0x20);
  auVar8._0_4_ = auVar11._0_4_ * local_148;
  auVar8._4_4_ = auVar11._4_4_ * fStack_144;
  auVar8._8_4_ = extraout_var._0_4_ * fStack_140;
  auVar8._12_4_ = extraout_var._4_4_ * fStack_13c;
  auVar10 = vfmadd231ps_fma(auVar8,auVar10,local_158);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar10);
  pRaster->super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar6 = MLTSampler::Get1D(sampler);
  auVar12._0_8_ = MLTSampler::Get2D(sampler);
  auVar12._8_56_ = extraout_var_00;
  auVar10 = vmovlhps_avx(auVar10,auVar12._0_16_);
  sample.time._0_1_ = SUB41(FVar6,0);
  sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar10._0_8_;
  sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  sample.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar10._8_8_;
  sample.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)auVar10._8_8_ >> 0x20);
  sample._17_7_ = (int7)(CONCAT44(0x3f800000,FVar6) >> 8);
  CameraHandle::GenerateRayDifferential(&crd,&this->camera,sample,lambda);
  auVar10._0_8_ = 0;
  local_158._0_8_ = 0;
  if (crd.set != true) goto LAB_0040b41f;
  if (((float)crd.optionalValue._96_4_ != 0.0) || (NAN((float)crd.optionalValue._96_4_))) {
LAB_0040b224:
    auVar9._0_4_ = (float)sampler->mutationsPerPixel;
    auVar9._4_12_ = in_register_00001284;
    if (auVar9._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar10 = vsqrtss_avx(auVar9,auVar9);
      fVar7 = auVar10._0_4_;
    }
    if (crd.set != true) {
LAB_0040b449:
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    auVar19 = (undefined1  [56])0x0;
    auVar10 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar7)),ZEXT416(0x3e000000));
    RayDifferential::ScaleDifferentials((RayDifferential *)&crd,auVar10._0_4_);
    if (crd.set == false) goto LAB_0040b449;
    TVar5.bits = (ulong)sampler | 0x8000000000000;
    local_b8.bits =
         (this->camera).
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_b0.
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )TVar5.bits;
    iVar3 = GenerateCameraSubpath
                      (&this->super_Integrator,(RayDifferential *)&crd,lambda,&local_b0,
                       scratchBuffer,maxDepth,(CameraHandle *)&local_b8,path,this->regularize);
    if (iVar3 == maxDepth) {
      MLTSampler::StartStream(sampler,1);
      path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_16c);
      local_c8.bits =
           (this->camera).
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_d0 = (this->lightSampler).
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 .bits;
      local_c0.
      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )TVar5.bits;
      iVar3 = GenerateLightSubpath
                        (&this->super_Integrator,lambda,&local_c0,(CameraHandle *)&local_c8,
                         scratchBuffer,local_16c,(path->field_2).ei.super_Interaction.time,
                         (LightSamplerHandle)&local_d0,path_00,this->regularize);
      auVar10._0_8_ = 0;
      auVar14 = ZEXT856(0);
      if (iVar3 == local_16c) {
        MLTSampler::StartStream(sampler,2);
        pRasterNew.set = false;
        local_d8.bits =
             (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
        local_e0.bits =
             (this->camera).
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_e8.
        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )TVar5.bits;
        SVar21 = ConnectBDPT(&this->super_Integrator,lambda,path_00,path,local_16c,maxDepth,
                             (LightSamplerHandle *)&local_d8,(CameraHandle *)&local_e0,&local_e8,
                             &pRasterNew,(Float *)0x0);
        auVar17._0_8_ = SVar21.values.values._8_8_;
        auVar17._8_56_ = auVar19;
        auVar13._0_8_ = SVar21.values.values._0_8_;
        auVar13._8_56_ = auVar14;
        auVar8 = vmovlhps_avx(auVar13._0_16_,auVar17._0_16_);
        auVar10._0_8_ = CONCAT44(fVar15 * auVar8._4_4_,fVar15 * auVar8._0_4_);
        auVar10._8_4_ = fVar15 * auVar8._8_4_;
        auVar10._12_4_ = fVar15 * auVar8._12_4_;
        if (pRasterNew.set == true) {
          pRaster->super_Tuple2<pbrt::Point2,_float> =
               (Tuple2<pbrt::Point2,_float>)pRasterNew.optionalValue;
        }
        auVar8 = vshufpd_avx(auVar10,auVar10,1);
        local_158._0_8_ = auVar8._0_8_;
      }
      goto LAB_0040b41f;
    }
  }
  else {
    uVar2 = 0;
    while (uVar4 = uVar2, uVar4 != 3) {
      fVar7 = *(float *)((long)&crd.optionalValue + uVar4 * 4 + 100);
      if ((fVar7 != 0.0) || (uVar2 = uVar4 + 1, NAN(fVar7))) break;
    }
    if (uVar4 < 3) goto LAB_0040b224;
  }
  auVar10._0_8_ = 0;
LAB_0040b41f:
  SVar21.values.values[2] = (float)local_158._0_4_;
  SVar21.values.values[3] = (float)local_158._4_4_;
  SVar21.values.values[0] = (float)(int)auVar10._0_8_;
  SVar21.values.values[1] = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  return (SampledSpectrum)SVar21.values.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    // Compute camera sample for MLT camera path
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();

    // Generate camera ray for MLT camera path
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew)
        *pRaster = *pRasterNew;
    return L;
}